

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
::increment_slow(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
                 *this)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  field_type i;
  byte bVar5;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *pbVar7;
  byte local_2d;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
  save;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_*>
  *this_local;
  
  bVar4 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::is_leaf(this->node_);
  if (bVar4) {
    iVar2 = this->position_;
    bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::finish(this->node_);
    if (iVar2 < (int)(uint)bVar5) {
      __assert_fail("position_ >= node_->finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x852,
                    "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, Reference = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, Pointer = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *]"
                   );
    }
    pbVar7 = this->node_;
    uVar3 = *(undefined8 *)&this->position_;
    while( true ) {
      uVar1 = this->position_;
      bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
              ::finish(this->node_);
      local_2d = 0;
      if (uVar1 == bVar5) {
        bVar4 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                ::is_root(this->node_);
        local_2d = bVar4 ^ 0xff;
      }
      if ((local_2d & 1) == 0) break;
      pbVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
               ::parent(this->node_);
      i = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::position(this->node_);
      pbVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
               ::child(pbVar6,i);
      if (pbVar6 != this->node_) {
        __assert_fail("node_->parent()->child(node_->position()) == node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x855,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, Reference = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, Pointer = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *]"
                     );
      }
      bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
              ::position(this->node_);
      this->position_ = (uint)bVar5;
      pbVar6 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
               ::parent(this->node_);
      this->node_ = pbVar6;
    }
    uVar1 = this->position_;
    bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::finish(this->node_);
    if (uVar1 == bVar5) {
      this->node_ = pbVar7;
      save.node_._0_4_ = (int)uVar3;
      this->position_ = (int)save.node_;
    }
  }
  else {
    iVar2 = this->position_;
    bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::finish(this->node_);
    if ((int)(uint)bVar5 <= iVar2) {
      __assert_fail("position_ < node_->finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x85e,
                    "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, const google::protobuf::FileDescriptorProto *, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *>>, 256, false>>, Reference = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> &, Pointer = std::pair<const std::basic_string<char>, const google::protobuf::FileDescriptorProto *> *]"
                   );
    }
    pbVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
             ::child(this->node_,(char)this->position_ + '\x01');
    this->node_ = pbVar7;
    while (bVar4 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   ::is_internal(this->node_), bVar4) {
      pbVar7 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
               ::start_child(this->node_);
      this->node_ = pbVar7;
    }
    bVar5 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
            ::start(this->node_);
    this->position_ = (uint)bVar5;
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node_->is_leaf()) {
    assert(position_ >= node_->finish());
    btree_iterator save(*this);
    while (position_ == node_->finish() && !node_->is_root()) {
      assert(node_->parent()->child(node_->position()) == node_);
      position_ = node_->position();
      node_ = node_->parent();
    }
    // TODO(ezb): assert we aren't incrementing end() instead of handling.
    if (position_ == node_->finish()) {
      *this = save;
    }
  } else {
    assert(position_ < node_->finish());
    node_ = node_->child(static_cast<field_type>(position_ + 1));
    while (node_->is_internal()) {
      node_ = node_->start_child();
    }
    position_ = node_->start();
  }
}